

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PaddingLayerParams::set_allocated_constant
          (PaddingLayerParams *this,PaddingLayerParams_PaddingConstant *constant)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  PaddingLayerParams_PaddingConstant *constant_local;
  PaddingLayerParams *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_PaddingType(this);
  if (constant != (PaddingLayerParams_PaddingConstant *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::PaddingLayerParams_PaddingConstant>::GetOwningArena
                   (constant);
    message_arena = (Arena *)constant;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::PaddingLayerParams_PaddingConstant>
                              (message_arena_00,constant,submessage_arena_00);
    }
    set_has_constant(this);
    (this->PaddingType_).constant_ = (PaddingLayerParams_PaddingConstant *)message_arena;
  }
  return;
}

Assistant:

void PaddingLayerParams::set_allocated_constant(::CoreML::Specification::PaddingLayerParams_PaddingConstant* constant) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_PaddingType();
  if (constant) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::PaddingLayerParams_PaddingConstant>::GetOwningArena(constant);
    if (message_arena != submessage_arena) {
      constant = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, constant, submessage_arena);
    }
    set_has_constant();
    PaddingType_.constant_ = constant;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.PaddingLayerParams.constant)
}